

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

void KillServerHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  ostream *poVar1;
  char *__s;
  long in_RCX;
  uint *in_RDX;
  undefined8 in_RSI;
  stringstream Status;
  _KillResponseMsg kill_response_msg;
  Remote_evpath_state *ev_state;
  KillServerMsg kill_msg;
  string local_240 [32];
  string local_220 [32];
  string local_200 [48];
  stringstream local_1d0 [16];
  ostream local_1c0 [312];
  uint64_t in_stack_ffffffffffffff78;
  ulong local_48;
  char *pcStack_40;
  long local_38;
  undefined8 local_10;
  
  pcStack_40 = (char *)0x0;
  local_48 = (ulong)*in_RDX;
  local_38 = in_RCX;
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_1d0);
  poVar1 = std::operator<<(local_1c0,"ADIOS files Opened: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,ADIOSFilesOpened);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,TotalGets);
  poVar1 = std::operator<<(poVar1," gets for ");
  readable_size_abi_cxx11_(in_stack_ffffffffffffff78);
  poVar1 = std::operator<<(poVar1,local_200);
  poVar1 = std::operator<<(poVar1,")  Simple files opened: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,SimpleFilesOpened);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,TotalSimpleReads);
  poVar1 = std::operator<<(poVar1," reads for ");
  readable_size_abi_cxx11_(in_stack_ffffffffffffff78);
  poVar1 = std::operator<<(poVar1,local_220);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::stringstream::str();
  __s = (char *)std::__cxx11::string::c_str();
  pcStack_40 = strdup(__s);
  std::__cxx11::string::~string(local_240);
  CMwrite(local_10,*(undefined8 *)(local_38 + 0x50),&local_48);
  free(pcStack_40);
  exit(0);
}

Assistant:

static void KillServerHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                              attr_list attrs)
{
    KillServerMsg kill_msg = static_cast<KillServerMsg>(vevent);
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    _KillResponseMsg kill_response_msg;
    memset(&kill_response_msg, 0, sizeof(kill_response_msg));
    kill_response_msg.KillResponseCondition = kill_msg->KillResponseCondition;
    std::stringstream Status;
    Status << "ADIOS files Opened: " << ADIOSFilesOpened << " (" << TotalGets << " gets for "
           << readable_size(TotalGetBytesSent) << ")  Simple files opened: " << SimpleFilesOpened
           << " (" << TotalSimpleReads << " reads for " << readable_size(TotalSimpleBytesSent)
           << ")";
    kill_response_msg.Status = strdup(Status.str().c_str());
    CMwrite(conn, ev_state->KillResponseFormat, &kill_response_msg);
    free(kill_response_msg.Status);
    exit(0);
}